

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<int,_QHashDummyValue> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QHashDummyValue>_>::findNode<int>
          (Data<QHashPrivate::Node<int,_QHashDummyValue>_> *this,int *key)

{
  long lVar1;
  bool bVar2;
  Data<QHashPrivate::Node<int,_QHashDummyValue>_> *in_RSI;
  long in_FS_OFFSET;
  Bucket bucket;
  int *in_stack_ffffffffffffffc8;
  undefined8 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<int>(in_RSI,in_stack_ffffffffffffffc8);
  bVar2 = Bucket::isUnused((Bucket *)0x8ac99b);
  if (bVar2) {
    local_20 = (Node<int,_QHashDummyValue> *)0x0;
  }
  else {
    local_20 = Bucket::node((Bucket *)0x8ac9b6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }